

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IElseReader.cpp
# Opt level: O1

void __thiscall IElseReader::getWord(IElseReader *this,string *str)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char cVar4;
  
  iVar3 = 4;
  do {
    std::istream::get();
    cVar4 = (char)str;
    std::__cxx11::string::push_back(cVar4);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  iVar3 = std::__cxx11::string::compare((char *)str);
  if (iVar3 != 0) {
    std::__cxx11::string::_M_replace((ulong)str,0,(char *)str->_M_string_length,0x10c0b4);
    return;
  }
  cVar1 = std::istream::get();
  bVar2 = IDictionary::isBlankSep(cVar1);
  if (bVar2) {
    do {
      std::__cxx11::string::push_back(cVar4);
      if (cVar1 == '\n') {
        std::__cxx11::string::push_back(cVar4);
      }
      cVar1 = std::istream::get();
      bVar2 = IDictionary::isBlankSep(cVar1);
    } while (bVar2);
  }
  if (cVar1 != ';') {
    if (cVar1 == '{') {
      std::__cxx11::string::push_back(cVar4);
      iVar3 = std::istream::get();
      do {
        iVar3 = iVar3 << 0x18;
        if (iVar3 == -0x1000000) {
          return;
        }
        std::__cxx11::string::push_back(cVar4);
        if (iVar3 == 0x7d000000) {
          bVar2 = false;
        }
        else {
          bVar2 = true;
          if (iVar3 == 0xa000000) {
            std::__cxx11::string::push_back(cVar4);
          }
        }
        iVar3 = std::istream::get();
      } while (bVar2);
    }
    else {
      do {
        std::__cxx11::string::push_back(cVar4);
        cVar1 = std::istream::get();
      } while (cVar1 != ';');
    }
    return;
  }
  std::__cxx11::string::push_back(cVar4);
  return;
}

Assistant:

void IElseReader::getWord(std::string &str) {
    char tempChar;
    int num_3l;

    for(int i=0;i<4;i++)
    {
        tempChar=m_ifs->get();
        str+=tempChar;
    }
    if(str!="else") {
        str = "";
        return;
    }
    while(true)
    {
        tempChar=m_ifs->get();
        if(IDictionary::isBlankSep(tempChar))
        {
            str+=tempChar;
            if(tempChar=='\n')
                str+='\n';
        }
        else
            break;
    }

    if(tempChar=='{')
    {
        str+=tempChar;
        num_3l=1;

        while ((tempChar=m_ifs->get())!=EOF&&num_3l)
        {
            str+=tempChar;
            if(tempChar=='\n')
            {
                str+='\n';
            }
            else if(tempChar=='}')
                num_3l--;
        }
    }
    else if(tempChar==';')
    {
        str+=tempChar;
        return;
    }
    else
    {
        do{
            str+=tempChar;
            tempChar=m_ifs->get();
        }while (tempChar!=';');
    }
}